

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# component.cpp
# Opt level: O3

void __thiscall
Component_addComponentMultipleTimes_Test::~Component_addComponentMultipleTimes_Test
          (Component_addComponentMultipleTimes_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Component, addComponentMultipleTimes)
{
    auto model = libcellml::Model::create("model");
    auto tomato = libcellml::Component::create("tomato");

    EXPECT_TRUE(model->addComponent(tomato));
    EXPECT_TRUE(model->addComponent(tomato));

    auto apple = model->takeComponent("tomato");
    apple->setName("apple");
    EXPECT_EQ("apple", model->component(0)->name());
    EXPECT_EQ("apple", tomato->name());
}